

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset_props.cpp
# Opt level: O3

USet * uset_openPatternOptions_63
                 (UChar *pattern,int32_t patternLength,uint32_t options,UErrorCode *ec)

{
  UnicodeSet *this;
  size_t size;
  UnicodeString *pattern_00;
  UnicodeString pat;
  ConstChar16Ptr local_70;
  UChar *local_68;
  UnicodeString local_58;
  
  size = (size_t)(patternLength == -1);
  local_70.p_ = pattern;
  icu_63::UnicodeString::UnicodeString(&local_58,patternLength == -1,&local_70,patternLength);
  local_68 = local_70.p_;
  this = (UnicodeSet *)icu_63::UMemory::operator_new((UMemory *)0x58,size);
  if (this == (UnicodeSet *)0x0) {
    *ec = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    pattern_00 = &local_58;
    icu_63::UnicodeSet::UnicodeSet(this,pattern_00,options,(SymbolTable *)0x0,ec);
    if (*ec < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002edfc2;
    icu_63::UnicodeSet::~UnicodeSet(this);
    icu_63::UMemory::operator_delete((UMemory *)this,pattern_00);
  }
  this = (UnicodeSet *)0x0;
LAB_002edfc2:
  icu_63::UnicodeString::~UnicodeString(&local_58);
  return (USet *)this;
}

Assistant:

U_CAPI USet* U_EXPORT2
uset_openPatternOptions(const UChar* pattern, int32_t patternLength,
                 uint32_t options,
                 UErrorCode* ec)
{
    UnicodeString pat(patternLength==-1, pattern, patternLength);
    UnicodeSet* set = new UnicodeSet(pat, options, NULL, *ec);
    /* test for NULL */
    if(set == 0) {
        *ec = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }

    if (U_FAILURE(*ec)) {
        delete set;
        set = NULL;
    }
    return (USet*) set;
}